

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapTypes.cpp
# Opt level: O3

void TTD::NSSnapType::ExtractSnapPropertyEntryInfo
               (SnapHandlerPropertyEntry *entry,PropertyId pid,PropertyAttributes attr,
               SnapEntryDataKindTag dataKind)

{
  SnapEntryDataKindTag SVar1;
  
  entry->PropertyRecordId = pid;
  entry->AttributeInfo = attr & AttributeMask;
  SVar1 = Clear;
  if ((attr >> 3 & 1) == 0 && 0x10 < pid + 1U) {
    SVar1 = dataKind;
  }
  entry->DataKind = SVar1;
  return;
}

Assistant:

void ExtractSnapPropertyEntryInfo(SnapHandlerPropertyEntry* entry, Js::PropertyId pid, Js::PropertyAttributes attr, SnapEntryDataKindTag dataKind)
        {
            entry->PropertyRecordId = pid;
            entry->AttributeInfo = ((SnapAttributeTag)attr) & SnapAttributeTag::AttributeMask;

            if((pid == Js::Constants::NoProperty) | Js::IsInternalPropertyId(pid) | ((attr & PropertyDeleted) == PropertyDeleted))
            {
                entry->DataKind = SnapEntryDataKindTag::Clear;
            }
            else
            {
                entry->DataKind = dataKind;
            }
        }